

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::write_int<unsigned_long_long,fmt::v5::basic_format_specs<char>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           *this,unsigned_long_long value,basic_format_specs<char> *spec)

{
  char spec_00;
  int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_> local_40;
  basic_format_specs<char> *local_20;
  basic_format_specs<char> *spec_local;
  unsigned_long_long value_local;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  
  local_20 = spec;
  spec_local = (basic_format_specs<char> *)value;
  value_local = (unsigned_long_long)this;
  spec_00 = basic_format_specs<char>::type(spec);
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::int_writer
            (&local_40,
             (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)this,(unsigned_long_long)spec_local,local_20);
  internal::
  handle_int_type_spec<char,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>>
            (spec_00,&local_40);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type(),
                                   int_writer<T, Spec>(*this, value, spec));
  }